

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void show_difference(roaring_bitmap_t *result,roaring_bitmap_t *hopedfor)

{
  _Bool _Var1;
  undefined8 in_RSI;
  roaring_bitmap_t *in_RDI;
  int i;
  int out_ctr;
  uint local_18;
  int local_14;
  uint32_t val;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    if (9999999 < (int)local_18) {
      return;
    }
    val = (uint32_t)((ulong)in_RSI >> 0x20);
    _Var1 = roaring_bitmap_contains(in_RDI,val);
    if ((_Var1) && (_Var1 = roaring_bitmap_contains(in_RDI,val), !_Var1)) {
      printf("result incorrectly has %d\n",(ulong)local_18);
      local_14 = local_14 + 1;
    }
    _Var1 = roaring_bitmap_contains(in_RDI,val);
    if ((!_Var1) && (_Var1 = roaring_bitmap_contains(in_RDI,val), _Var1)) {
      printf("result incorrectly omits %d\n",(ulong)local_18);
      local_14 = local_14 + 1;
    }
    if (0x14 < local_14) break;
    local_18 = local_18 + 1;
  }
  printf("20 errors seen, stopping comparison\n");
  return;
}

Assistant:

static void show_difference(roaring_bitmap_t *result,
                            roaring_bitmap_t *hopedfor) {
    int out_ctr = 0;
    for (int i = 0; i < 10000000; ++i) {
        if (roaring_bitmap_contains(result, i) &&
            !roaring_bitmap_contains(hopedfor, i)) {
            printf("result incorrectly has %d\n", i);
            ++out_ctr;
        }
        if (!roaring_bitmap_contains(result, i) &&
            roaring_bitmap_contains(hopedfor, i)) {
            printf("result incorrectly omits %d\n", i);
            ++out_ctr;
        }
        if (out_ctr > 20) {
            printf("20 errors seen, stopping comparison\n");
            break;
        }
    }
}